

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool skipheader;
  bool useReturnPeriodFile;
  int iVar2;
  long lVar3;
  allocator local_1fa;
  allocator local_1f9;
  bool outputFlags [8];
  string local_1e8;
  string local_1c8;
  FILE *fout [8];
  string subfolder;
  string local_148;
  string local_128;
  string parquetOutFiles [2];
  sigaction sa;
  
  fout[6] = (FILE *)0x0;
  fout[7] = (FILE *)0x0;
  fout[4] = (FILE *)0x0;
  fout[5] = (FILE *)0x0;
  fout[2] = (FILE *)0x0;
  fout[3] = (FILE *)0x0;
  fout[0] = (FILE *)0x0;
  fout[1] = (FILE *)0x0;
  outputFlags[0] = false;
  outputFlags[1] = false;
  outputFlags[2] = false;
  outputFlags[3] = false;
  outputFlags[4] = false;
  outputFlags[5] = false;
  outputFlags[6] = false;
  outputFlags[7] = false;
  std::__cxx11::string::string((string *)parquetOutFiles,"",(allocator *)&sa);
  std::__cxx11::string::string((string *)(parquetOutFiles + 1),"",(allocator *)&subfolder);
  subfolder._M_dataplus._M_p = (pointer)&subfolder.field_2;
  subfolder._M_string_length = 0;
  subfolder.field_2._M_local_buf[0] = '\0';
  useReturnPeriodFile = false;
  bVar1 = false;
  do {
    skipheader = bVar1;
    iVar2 = getopt(argc,argv,"vhrHF:W:M:S:K:f:w:s:m:");
    bVar1 = skipheader;
    switch(iVar2) {
    case 0x6d:
      std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_1e8);
      openpipe(7,(string *)&sa,fout);
      std::__cxx11::string::~string((string *)&sa);
      outputFlags[7] = true;
      break;
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x74:
    case 0x75:
      goto switchD_0010f49a_caseD_47;
    case 0x72:
      useReturnPeriodFile = true;
      break;
    case 0x73:
      std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_1e8);
      openpipe(6,(string *)&sa,fout);
      std::__cxx11::string::~string((string *)&sa);
      outputFlags[6] = true;
      break;
    case 0x76:
      fprintf(_stderr,"%s : version: %s\n",*argv,"");
      goto LAB_0010f8d6;
    case 0x77:
      std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_1e8);
      openpipe(5,(string *)&sa,fout);
      std::__cxx11::string::~string((string *)&sa);
      outputFlags[5] = true;
      break;
    default:
      bVar1 = true;
      switch(iVar2) {
      case 0x46:
        std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_1e8);
        openpipe(0,(string *)&sa,fout);
        std::__cxx11::string::~string((string *)&sa);
        outputFlags[0] = true;
        bVar1 = skipheader;
        break;
      case 0x47:
      case 0x49:
      case 0x4a:
      case 0x4c:
switchD_0010f49a_caseD_47:
        help();
LAB_0010f8d6:
        exit(1);
      case 0x48:
        break;
      case 0x4b:
        std::__cxx11::string::assign((char *)&subfolder);
        bVar1 = skipheader;
        break;
      case 0x4d:
        std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_1e8);
        openpipe(3,(string *)&sa,fout);
        std::__cxx11::string::~string((string *)&sa);
        outputFlags[3] = true;
        bVar1 = skipheader;
        break;
      default:
        if (iVar2 == 0x53) {
          std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_1e8);
          openpipe(2,(string *)&sa,fout);
          std::__cxx11::string::~string((string *)&sa);
          outputFlags[2] = true;
          bVar1 = skipheader;
        }
        else if (iVar2 == 0x57) {
          std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_1e8);
          openpipe(1,(string *)&sa,fout);
          std::__cxx11::string::~string((string *)&sa);
          outputFlags[1] = true;
          bVar1 = skipheader;
        }
        else {
          if (iVar2 != 0x66) {
            if (iVar2 == -1) {
              if (argc == 1) {
                fwrite("FATAL: Invalid parameters\n",0x1a,1,_stderr);
                help();
              }
              progname = *argv;
              memset(&sa,0,0x98);
              sigemptyset((sigset_t *)&sa.sa_mask);
              sa.__sigaction_handler.sa_handler = segfault_sigaction;
              sa.sa_flags = 4;
              sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
              std::__cxx11::string::string((string *)&local_128,"",(allocator *)&local_1e8);
              std::__cxx11::string::string((string *)&local_148,"",(allocator *)&local_1c8);
              initstreams(&local_128,&local_148);
              std::__cxx11::string::~string((string *)&local_148);
              std::__cxx11::string::~string((string *)&local_128);
              std::__cxx11::string::string((string *)&local_1e8,progname,&local_1f9);
              std::__cxx11::string::string((string *)&local_1c8,"INFO",&local_1fa);
              logprintf(&local_1e8,&local_1c8,"starting process..\n");
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::~string((string *)&local_1e8);
              leccalc::doit(&subfolder,fout,useReturnPeriodFile,skipheader,outputFlags,false,
                            parquetOutFiles,progname);
              std::__cxx11::string::string((string *)&local_1e8,progname,&local_1f9);
              std::__cxx11::string::string((string *)&local_1c8,"INFO",&local_1fa);
              logprintf(&local_1e8,&local_1c8,"finishing process..\n");
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::string::~string((string *)&subfolder);
              lVar3 = 0x20;
              do {
                std::__cxx11::string::~string
                          ((string *)((long)&parquetOutFiles[0]._M_dataplus._M_p + lVar3));
                lVar3 = lVar3 + -0x20;
              } while (lVar3 != -0x20);
              return 0;
            }
            goto switchD_0010f49a_caseD_47;
          }
          std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_1e8);
          openpipe(4,(string *)&sa,fout);
          std::__cxx11::string::~string((string *)&sa);
          outputFlags[4] = true;
          bVar1 = skipheader;
        }
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
	bool useReturnPeriodFile = false;
	FILE* fout[] = { nullptr,nullptr,nullptr,nullptr,nullptr,nullptr,nullptr,nullptr };
	bool outputFlags[8] = { false, false, false, false,
				false, false, false, false };
	const bool ordFlag = false;   // Turn off ORD output
	const std::string parquetOutFiles[2] = { "", "" };

	std::string subfolder;
	int opt;
	bool skipheader = false;
	while ((opt = getopt(argc, argv, "vhrHF:W:M:S:K:f:w:s:m:")) != -1) {
		switch (opt) {
		case 'K':
			subfolder = optarg;
			break;
		case 'H':
			skipheader = true;
			break;
		case 'F':
			openpipe(AGG_FULL_UNCERTAINTY, optarg, fout);
			outputFlags[AGG_FULL_UNCERTAINTY] = true;
			break;
		case 'f':
			openpipe(OCC_FULL_UNCERTAINTY, optarg, fout);
			outputFlags[OCC_FULL_UNCERTAINTY] = true;
			break;
		case 'W':
			openpipe(AGG_WHEATSHEAF, optarg, fout);
			outputFlags[AGG_WHEATSHEAF] = true;
			break;
		case 'w':
			openpipe(OCC_WHEATSHEAF, optarg, fout);
			outputFlags[OCC_WHEATSHEAF] = true;
			break;
		case 'S':
			openpipe(AGG_SAMPLE_MEAN, optarg, fout);
			outputFlags[AGG_SAMPLE_MEAN] = true;
			break;
		case 's':
			openpipe(OCC_SAMPLE_MEAN, optarg, fout);
			outputFlags[OCC_SAMPLE_MEAN] = true;
			break;
		case 'M':
			openpipe(AGG_WHEATSHEAF_MEAN, optarg, fout);
			outputFlags[AGG_WHEATSHEAF_MEAN] = true;
			break;
		case 'm':
			openpipe(OCC_WHEATSHEAF_MEAN, optarg, fout);
			outputFlags[OCC_WHEATSHEAF_MEAN] = true;
			break;
		case 'r':
			useReturnPeriodFile = true;
			break;
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			exit(EXIT_FAILURE);
			break;
		case 'h':
			help();
			::exit(EXIT_FAILURE);
			break;
		default:
			help();
			::exit(EXIT_FAILURE);
		}
	}

	if (argc == 1) {
		fprintf(stderr, "FATAL: Invalid parameters\n");
		help();
	}

	progname = argv[0];
#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	try {
		initstreams();
        	logprintf(progname, "INFO", "starting process..\n");
		leccalc::doit(subfolder, fout, useReturnPeriodFile, skipheader,
			      outputFlags, ordFlag, parquetOutFiles, progname);
        	logprintf(progname, "INFO", "finishing process..\n");
		return EXIT_SUCCESS;
	}catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}
	
}